

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyevent.c
# Opt level: O2

void taking_mouse_down(void)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  sbyte sVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint *puVar12;
  uint uVar13;
  uint *puVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  uint *puVar18;
  uint local_60;
  uint local_5c;
  uint *local_58;
  int local_50;
  
  uVar2 = displaywidth;
  iVar1 = LastCursorClippingX;
  if (DisplayInitialized != 0) {
    if (LastCursorX < 0) {
      uVar3 = -(ulong)(7U - LastCursorX >> 3);
    }
    else {
      uVar3 = (ulong)((uint)LastCursorX >> 3);
    }
    uVar3 = (long)DisplayRegion68k +
            uVar3 + (long)((int)displaywidth / 0x10) * (long)LastCursorY * 2;
    puVar18 = (uint *)(uVar3 & 0xfffffffffffffffc);
    uVar8 = (LastCursorX & 7U) + ((uint)uVar3 & 3) * 8;
    local_5c = (LastCursorClippingX + uVar8) - 1 & 0x1f;
    uVar6 = 0;
    uVar13 = -(uint)(uVar8 == 0) | ~(-1 << (-(char)uVar8 & 0x1fU));
    local_60 = -1 << (~(byte)local_5c & 0x1f);
    uVar15 = local_60 & uVar13;
    uVar7 = -uVar8;
    local_58 = (uint *)MonoCursor_savebitmap;
    local_50 = LastCursorClippingX;
    uVar10 = 0;
    iVar17 = LastCursorClippingY;
    uVar11 = uVar8;
    while( true ) {
      sVar4 = (sbyte)(uVar7 & 0x1f);
      if (iVar17 < 1) break;
      uVar7 = -(uint)((uVar7 & 0x1f) == 0) | ~(-1 << sVar4);
      bVar5 = (byte)uVar8;
      if (uVar11 < uVar6) {
        uVar9 = *local_58 << sVar4;
        if (0x20 < (int)(iVar1 + uVar6)) {
          uVar8 = local_58[1];
          puVar12 = local_58 + 2;
          uVar9 = uVar9 | uVar8 >> (bVar5 & 0x1f) & uVar7;
          goto LAB_00123123;
        }
        puVar12 = local_58 + 1;
      }
      else {
        uVar8 = *local_58;
        puVar12 = local_58 + 1;
        uVar9 = uVar8 >> (bVar5 & 0x1f) & uVar7;
LAB_00123123:
        uVar10 = uVar8 << sVar4 & ~uVar7;
      }
      puVar14 = puVar18;
      if ((int)(iVar1 + uVar11) < 0x21) {
LAB_001231e7:
        *puVar14 = (uVar9 ^ *puVar14) & uVar15 ^ *puVar14;
      }
      else {
        iVar16 = ((int)(uVar11 + iVar1) >> 5) + -1;
        *puVar18 = (uVar9 ^ *puVar18) & uVar13 ^ *puVar18;
        puVar14 = puVar18 + 1;
        if (uVar6 == uVar11) {
          for (; 0 < iVar16; iVar16 = iVar16 + -1) {
            uVar8 = *puVar12;
            puVar12 = puVar12 + 1;
            *puVar14 = uVar8;
            puVar14 = puVar14 + 1;
          }
        }
        else {
          for (; 0 < iVar16; iVar16 = iVar16 + -1) {
            uVar8 = *puVar12;
            puVar12 = puVar12 + 1;
            *puVar14 = uVar8 >> (bVar5 & 0x1f) | uVar10;
            puVar14 = puVar14 + 1;
            uVar10 = uVar8 << sVar4;
          }
        }
        if (local_5c != 0x1f) {
          uVar15 = local_60;
          uVar9 = uVar10;
          if ((local_50 - 1U & 0x1f) <= local_5c) {
            uVar9 = *puVar12 >> (bVar5 & 0x1f) & uVar7 | uVar10;
          }
          goto LAB_001231e7;
        }
      }
      iVar17 = iVar17 + -1;
      uVar9 = uVar11 + uVar2;
      puVar18 = puVar18 + ((int)uVar9 >> 5);
      uVar11 = uVar9 & 0x1f;
      local_5c = (uVar11 + iVar1) - 1 & 0x1f;
      local_60 = -1 << (~(byte)local_5c & 0x1f);
      uVar13 = -(uint)(uVar11 == 0) | ~(-1 << (-(char)uVar11 & 0x1fU));
      uVar8 = uVar6 + 0x10;
      local_58 = local_58 + (uVar8 >> 5);
      local_50 = iVar1 + uVar6 + 0x10;
      uVar7 = uVar8 - uVar9;
      uVar15 = local_60 & uVar13;
      uVar6 = uVar8 & 0x1f;
      uVar8 = uVar9 - uVar8 & 0x1f;
    }
  }
  return;
}

Assistant:

void taking_mouse_down(void) {
  DLword *srcbase, *dstbase;
  static int sx, dx, w, h, srcbpl, dstbpl, backwardflg = 0;
  static int src_comp = 0, op = 0, gray = 0, num_gray = 0, curr_gray_line = 0;

#ifdef DOS
  (currentdsp->mouse_invisible)(currentdsp, IOPage);
#else
  if (!DisplayInitialized) return;

  /* restore saved image */
  srcbase = MonoCursor_savebitmap;
  dstbase = DisplayRegion68k + ((LastCursorY)*DLWORD_PERLINE); /* old y */
  sx = 0;
  dx = LastCursorX;        /* old x */
  w = LastCursorClippingX; /* Old clipping */
  h = LastCursorClippingY;
  srcbpl = HARD_CURSORWIDTH;
  dstbpl = displaywidth;
  op = 0;
  new_bitblt_code;
#ifdef DISPLAYBUFFER
  flush_display_region(dx, (LastCursorY), w, h);
#endif /* DISPLAYBUFFER */
#endif /* DOS */
}